

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::decompressEAC_R11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  deInt16 dVar1;
  deUint16 dVar2;
  int iVar3;
  void *pvVar4;
  deUint16 *dstPixel_1;
  deUint16 *srcPixel_1;
  deInt16 *dstPixel;
  deInt16 *srcPixel;
  int x;
  int y;
  deUint8 uncompressedBlock [32];
  deUint64 compressedBlock;
  int dstPixelSize;
  int dstRowPitch;
  deUint8 *dstPtr;
  bool signedMode_local;
  deUint8 *src_local;
  PixelBufferAccess *dst_local;
  
  pvVar4 = PixelBufferAccess::getDataPtr(dst);
  iVar3 = ConstPixelBufferAccess::getRowPitch(&dst->super_ConstPixelBufferAccess);
  uncompressedBlock._24_8_ = EtcDecompressInternal::get64BitBlock(src,0);
  EtcDecompressInternal::decompressEAC11Block((deUint8 *)&x,uncompressedBlock._24_8_,signedMode);
  for (srcPixel._4_4_ = 0; srcPixel._4_4_ < 4; srcPixel._4_4_ = srcPixel._4_4_ + 1) {
    for (srcPixel._0_4_ = 0; (int)srcPixel < 4; srcPixel._0_4_ = (int)srcPixel + 1) {
      if (signedMode) {
        dVar1 = EtcDecompressInternal::extend11To16WithSign
                          (*(deInt16 *)((long)&x + (long)((srcPixel._4_4_ * 4 + (int)srcPixel) * 2))
                          );
        *(deInt16 *)((long)pvVar4 + (long)((int)srcPixel << 1) + (long)(srcPixel._4_4_ * iVar3)) =
             dVar1;
      }
      else {
        dVar2 = EtcDecompressInternal::extend11To16
                          (*(deUint16 *)
                            ((long)&x + (long)((srcPixel._4_4_ * 4 + (int)srcPixel) * 2)));
        *(deUint16 *)((long)pvVar4 + (long)((int)srcPixel << 1) + (long)(srcPixel._4_4_ * iVar3)) =
             dVar2;
      }
    }
  }
  return;
}

Assistant:

void decompressEAC_R11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_R11;

	const deUint64	compressedBlock = get64BitBlock(src, 0);
	deUint8			uncompressedBlock[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlock, compressedBlock, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_R11 == 2);

			if (signedMode)
			{
				const deInt16* const	srcPixel = (deInt16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel = (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixel[0]);
			}
			else
			{
				const deUint16* const	srcPixel = (deUint16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel = (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixel[0]);
			}
		}
	}
}